

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O1

char * __thiscall CVmStringSource::read_line(CVmStringSource *this,char *buf,size_t len)

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  
  if (this->pos == this->memlen) {
    buf = (char *)0x0;
  }
  else {
    lVar5 = this->pos;
    pcVar4 = buf;
    if (len != 0 && lVar5 < this->memlen) {
      sVar3 = len - 1;
      while( true ) {
        len = sVar3;
        cVar1 = this->mem[lVar5];
        if ((cVar1 == '\r') || (cVar1 == '\n')) break;
        this->pos = lVar5 + 1;
        *pcVar4 = this->mem[lVar5];
        pcVar4 = pcVar4 + 1;
        lVar5 = this->pos;
        if ((this->memlen <= lVar5) || (sVar3 = len - 1, len == 0)) goto LAB_0020595b;
      }
      *pcVar4 = '\n';
      pcVar4 = pcVar4 + 1;
      lVar2 = this->pos;
      lVar5 = lVar2 + 1;
      this->pos = lVar5;
      if ((lVar5 < this->memlen) && ((this->mem[lVar2] == '\r' && (this->mem[lVar5] == '\n')))) {
        this->pos = lVar2 + 2;
      }
    }
LAB_0020595b:
    if (len != 0) {
      *pcVar4 = '\0';
      return buf;
    }
  }
  return buf;
}

Assistant:

virtual char *read_line(char *buf, size_t len)
    {
        /* if we have no bytes left, return null for EOF */
        if (pos == memlen)
            return 0;
        
        /* read bytes until we encounter a CR, LF, or CR-LF */
        char *dst = buf;
        while (pos < memlen && len > 0)
        {
            /* check for a line terminator */
            if (mem[pos] == 10 || mem[pos] == 13)
            {
                /* 
                 *   add a newline to the result (it's always '\n' in the
                 *   result buffer regardless of the type of newline in the
                 *   source) 
                 */
                *dst++ = '\n';
                --len;

                /* 
                 *   if this is a CR-LF sequence, skip both characters;
                 *   otherwise just skip the single CR or LF
                 */
                ++pos;
                if (pos < memlen && mem[pos-1] == 13 && mem[pos] == 10)
                    ++pos;

                /* we're done */
                break;
            }

            /* copy this byte */
            *dst++ = mem[pos++];

            /* count it against the remaining buffer length */
            --len;
        }

        /* add a null terminator if possible */
        if (len != 0)
            *dst = '\0';

        /* return the original buffer pointer */
        return buf;
    }